

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_wrappers.hpp
# Opt level: O1

__pid_t __thiscall pcplusplus::threads::generic_threads::fork(generic_threads *this)

{
  thread *ptVar1;
  int iVar2;
  ulong uVar3;
  offset_in_generic_threads_to_subr local_78 [4];
  generic_threads *local_58;
  thread local_50 [4];
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this->mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if (this->num_threads != 0) {
    uVar3 = 0;
    do {
      local_78[0] = 1;
      local_78[1] = 0;
      local_58 = this;
      std::thread::
      thread<void(pcplusplus::threads::generic_threads::*)(),pcplusplus::threads::generic_threads*,void>
                (local_50,local_78,&local_58);
      ptVar1 = (this->threads)._M_t.
               super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread[]>_>._M_t.
               super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread[]>_>.
               super__Head_base<0UL,_std::thread_*,_false>._M_head_impl;
      if (ptVar1[uVar3]._M_id._M_thread != 0) {
        std::terminate();
      }
      ptVar1[uVar3]._M_id._M_thread = (native_handle_type)local_50[0]._M_id._M_thread;
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->num_threads);
  }
  iVar2 = pthread_mutex_unlock((pthread_mutex_t *)this->mutex);
  return iVar2;
}

Assistant:

virtual inline void fork(){
		lock();
		try{
		    for(size_t i = 0; i < num_threads; ++i)
			threads[i] = std::thread(&generic_threads::thread_routine, this);
		}
		catch(const std::system_error& e){
		    throw exceptions::thread_failure("Failed to fork a " + thread_type + " thread.");
		}
		unlock();
	    }